

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O2

void __thiscall
GenerateToAddressRequestHandler::~GenerateToAddressRequestHandler
          (GenerateToAddressRequestHandler *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_BaseRequestHandler)._vptr_BaseRequestHandler =
       (_func_int **)&PTR__GenerateToAddressRequestHandler_001d3838;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__cxx11::string::~string((string *)&this->address_str);
    return;
  }
  __stack_chk_fail();
}

Assistant:

UniValue PrepareRequest(const std::string& method, const std::vector<std::string>& args) override
    {
        address_str = args.at(1);
        UniValue params{RPCConvertValues("generatetoaddress", args)};
        return JSONRPCRequestObj("generatetoaddress", params, 1);
    }